

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

int __thiscall ThreadPool::busyThreads(ThreadPool *this)

{
  int iVar1;
  
  std::mutex::lock(&this->mMutex);
  iVar1 = this->mBusyThreads;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return iVar1;
}

Assistant:

int ThreadPool::busyThreads() const
{
    std::lock_guard<std::mutex> lock(mMutex);
    return mBusyThreads;
}